

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O3

char * map_enum(enum_map_t *map,uint32_t value)

{
  uint32_t uVar1;
  enum_map_t *peVar2;
  
  uVar1 = map->value;
  if (uVar1 != 0xffffffff) {
    peVar2 = map + 1;
    do {
      if (uVar1 == value) {
        return peVar2[-1].name;
      }
      uVar1 = peVar2->value;
      peVar2 = peVar2 + 1;
    } while (uVar1 != 0xffffffff);
  }
  snprintf(map_enum::unknown,0x10,"unknown (%u)");
  map_enum::unknown[0xf] = '\0';
  return map_enum::unknown;
}

Assistant:

static const char *
map_enum(const enum_map_t *map, uint32_t value) {
    static char unknown[16];
    size_t i = 0;

    while (map[i].value < UINT32_MAX) {
        if (map[i].value == value) {
            return map[i].name;
        }
        i++;
    }

    snprintf(unknown, sizeof(unknown), "unknown (%u)", value);
    unknown[sizeof(unknown) - 1] = '\0';

    return unknown;
}